

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O1

void __thiscall sf::RenderTarget::initialize(RenderTarget *this)

{
  Uint64 UVar1;
  uint uVar2;
  uint extraout_var;
  Lock lock;
  FloatRect local_28;
  
  uVar2 = (*this->_vptr_RenderTarget[2])();
  (*this->_vptr_RenderTarget[2])(this);
  local_28.height = (float)extraout_var;
  local_28.left = 0.0;
  local_28.top = 0.0;
  local_28.width = (float)uVar2;
  View::reset(&this->m_defaultView,&local_28);
  memcpy(&this->m_view,&this->m_defaultView,0xa6);
  (this->m_cache).glStatesSet = false;
  Lock::Lock((Lock *)&local_28,(Mutex *)&(anonymous_namespace)::mutex);
  UVar1 = (anonymous_namespace)::getUniqueId()::id;
  (anonymous_namespace)::getUniqueId()::id = (anonymous_namespace)::getUniqueId()::id + 1;
  Lock::~Lock((Lock *)&local_28);
  this->m_id = UVar1;
  return;
}

Assistant:

void RenderTarget::initialize()
{
    // Setup the default and current views
    m_defaultView.reset(FloatRect(0, 0, static_cast<float>(getSize().x), static_cast<float>(getSize().y)));
    m_view = m_defaultView;

    // Set GL states only on first draw, so that we don't pollute user's states
    m_cache.glStatesSet = false;

    // Generate a unique ID for this RenderTarget to track
    // whether it is active within a specific context
    m_id = getUniqueId();
}